

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O1

bool IntBounds::IsLessThanOrEqualTo(int constantValue,int constantBoundBase,int offset)

{
  bool bVar1;
  int iVar2;
  
  if (offset == -1) {
    bVar1 = constantValue < constantBoundBase;
  }
  else if (offset == 0) {
    bVar1 = constantValue <= constantBoundBase;
  }
  else {
    iVar2 = offset + constantBoundBase;
    if (offset < 0) {
      bVar1 = iVar2 < constantBoundBase && constantValue <= iVar2;
    }
    else {
      bVar1 = iVar2 < constantBoundBase || constantValue <= iVar2;
    }
  }
  return bVar1;
}

Assistant:

bool IntBounds::IsLessThanOrEqualTo(const int constantValue, const int constantBoundBase, const int offset)
{
    if(offset == 0)
        return constantValue <= constantBoundBase;
    if(offset == -1)
        return constantValue < constantBoundBase;

    // use unsigned to avoid signed int overflow
    const int constantBound = (unsigned)constantBoundBase + (unsigned)offset;
    return
        offset >= 0
            ? constantBound < constantBoundBase || constantValue <= constantBound
            : constantBound < constantBoundBase && constantValue <= constantBound;
}